

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QByteArray,QByteArray>::emplaceValue<QByteArray_const&>
          (Node<QByteArray,_QByteArray> *this,QByteArray *args)

{
  long lVar1;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray(in_RDI,in_stack_ffffffffffffffb8);
  QByteArray::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QByteArray::~QByteArray((QByteArray *)0x1642eb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }